

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O1

string * lf_random_string_abi_cxx11_(void)

{
  uint uVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  string *in_RDI;
  string str;
  random_device rd;
  mt19937 generator;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2740;
  long local_2738;
  char local_2730 [16];
  random_device local_2720;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1398;
  
  local_2740._M_current = local_2730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2740,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz",
             "");
  std::random_device::random_device(&local_2720);
  uVar1 = std::random_device::_M_getval();
  local_1398._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar2 = local_1398._M_x[0];
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    local_1398._M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_1398._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (local_2740,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_2740._M_current + local_2738),&local_1398);
  std::__cxx11::string::substr((ulong)in_RDI,(ulong)&local_2740);
  std::random_device::_M_fini();
  if (local_2740._M_current != local_2730) {
    operator_delete(local_2740._M_current);
  }
  return in_RDI;
}

Assistant:

std::string lf_random_string()
{
    std::string str("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz");

    std::random_device rd;
    std::mt19937 generator(rd());

    std::shuffle(str.begin(), str.end(), generator);

    return str.substr(0, 8);
}